

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

void __thiscall
olc::PixelGameEngine::FillRectDecal(PixelGameEngine *this,vf2d *pos,vf2d *size,Pixel col)

{
  array<olc::Pixel,_4UL> cols;
  array<olc::v2d_generic<float>,_4UL> points;
  anon_union_4_2_12391da5_for_Pixel_0 local_58;
  anon_union_4_2_12391da5_for_Pixel_0 local_54;
  anon_union_4_2_12391da5_for_Pixel_0 local_50;
  anon_union_4_2_12391da5_for_Pixel_0 local_4c;
  vf2d local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  vf2d local_20;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  float local_8;
  float local_4;
  
  local_20.x = pos->x;
  local_20.y = pos->y;
  local_14 = size->y + local_20.y;
  local_10 = local_20.x + size->x;
  local_38 = 0;
  uStack_30 = 0;
  local_48.x = 0.0;
  local_48.y = 0.0;
  uStack_40 = 0;
  local_58 = col.field_0;
  local_54 = col.field_0;
  local_50 = col.field_0;
  local_4c = col.field_0;
  local_18 = local_20.x;
  local_c = local_14;
  local_8 = local_10;
  local_4 = local_20.y;
  DrawExplicitDecal(this,(Decal *)0x0,&local_20,&local_48,(Pixel *)&local_58.field_1,4);
  return;
}

Assistant:

void PixelGameEngine::FillRectDecal(const olc::vf2d& pos, const olc::vf2d& size, const olc::Pixel col)
	{
		std::array<olc::vf2d, 4> points = { { {pos}, {pos.x, pos.y + size.y}, {pos + size}, {pos.x + size.x, pos.y} } };
		std::array<olc::vf2d, 4> uvs = { {{0,0},{0,0},{0,0},{0,0}} };
		std::array<olc::Pixel, 4> cols = { {col, col, col, col} };
		DrawExplicitDecal(nullptr, points.data(), uvs.data(), cols.data(), 4);
	}